

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O0

short * vrna_seq_encode_simple(char *sequence,vrna_md_t *md)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  short *local_28;
  short *S;
  uint l;
  uint i;
  vrna_md_t *md_local;
  char *sequence_local;
  
  local_28 = (short *)0x0;
  if ((sequence != (char *)0x0) && (md != (vrna_md_t *)0x0)) {
    sVar3 = strlen(sequence);
    uVar1 = (uint)sVar3;
    local_28 = (short *)vrna_alloc((uVar1 + 2) * 2);
    for (S._4_4_ = 1; S._4_4_ <= uVar1; S._4_4_ = S._4_4_ + 1) {
      iVar2 = vrna_nucleotide_encode(sequence[S._4_4_ - 1],md);
      local_28[S._4_4_] = (short)iVar2;
    }
    local_28[uVar1 + 1] = local_28[1];
    *local_28 = (short)sVar3;
  }
  return local_28;
}

Assistant:

PUBLIC short *
vrna_seq_encode_simple(const char *sequence,
                       vrna_md_t  *md)
{
  unsigned int  i, l;
  short         *S = NULL;

  if (sequence && md) {
    l = (unsigned int)strlen(sequence);
    S = (short *)vrna_alloc(sizeof(short) * (l + 2));

    for (i = 1; i <= l; i++) /* make numerical encoding of sequence */
      S[i] = (short)vrna_nucleotide_encode(sequence[i - 1], md);

    S[l + 1]  = S[1];
    S[0]      = (short)l;
  }

  return S;
}